

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtmul<wabt::interp::Simd<long,(unsigned_char)2>,wabt::interp::Simd<int,(unsigned_char)4>,true>
          (Thread *this)

{
  Value value;
  Value VVar1;
  Value VVar2;
  
  VVar1 = Pop(this);
  VVar2 = Pop(this);
  value.field_0._0_8_ = (long)(int)VVar1.field_0.i32_ * (long)(int)VVar2.field_0.i32_;
  value.field_0._8_8_ = ((long)VVar1.field_0.i64_ >> 0x20) * ((long)VVar2.field_0.i64_ >> 0x20);
  Push(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtmul() {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = (low ? 0 : S::lanes) + i;
    result[i] = U(lhs[laneidx]) * U(rhs[laneidx]);
  }
  Push(result);
  return RunResult::Ok;
}